

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_term_put_wc(StripCtrlCharsImpl *scc,unsigned_long wc)

{
  _Bool _Var1;
  size_t local_60;
  size_t produced;
  char outbuf [6];
  wchar_t local_2c;
  undefined1 auStack_28 [4];
  wchar_t width;
  ptrlen prefix;
  unsigned_long wc_local;
  StripCtrlCharsImpl *scc_local;
  
  _auStack_28 = make_ptrlen("",0);
  local_2c = term_char_width(scc->term,(wchar_t)wc);
  prefix.len = wc;
  if (((wc & 0xffffffffffffff60) == 0) || (local_2c < L'\0')) {
    _Var1 = stripctrl_ctrlchar_ok(scc,(wchar_t)wc);
    if (_Var1) {
      if (local_2c < L'\0') {
        local_2c = L'\0';
      }
    }
    else {
      if (scc->substitution == L'\0') {
        return;
      }
      prefix.len = (size_t)scc->substitution;
      local_2c = term_char_width(scc->term,scc->substitution);
      if (local_2c < L'\0') {
        __assert_fail("width >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,199,"void stripctrl_term_put_wc(StripCtrlCharsImpl *, unsigned long)");
      }
    }
    if (prefix.len == 10) {
      _auStack_28 = make_ptrlen("\r",1);
    }
  }
  stripctrl_check_line_limit(scc,(wchar_t)prefix.len,(long)local_2c);
  if (prefix.ptr != (void *)0x0) {
    BinarySink_put_datapl(scc->bs_out->binarysink_,_auStack_28);
  }
  if (prefix.len - 0xd800 < 0x800) {
    prefix.len = prefix.len & 0xff;
  }
  _Var1 = in_utf(scc->term);
  if (_Var1) {
    local_60 = encode_utf8((void *)((long)&produced + 2),prefix.len);
  }
  else {
    produced._2_1_ = (undefined1)prefix.len;
    local_60 = 1;
  }
  if (local_60 != 0) {
    BinarySink_put_data(scc->bs_out->binarysink_,(void *)((long)&produced + 2),local_60);
  }
  return;
}

Assistant:

static inline void stripctrl_term_put_wc(
    StripCtrlCharsImpl *scc, unsigned long wc)
{
    ptrlen prefix = PTRLEN_LITERAL("");
    int width = term_char_width(scc->term, wc);

    if (!(wc & ~0x9F) || width < 0) {
        /* This is something the terminal interprets as a control
         * character. */
        if (!stripctrl_ctrlchar_ok(scc, wc)) {
            if (!scc->substitution) {
                return;
            } else {
                wc = scc->substitution;
                width = term_char_width(scc->term, wc);
                assert(width >= 0);
            }
        } else {
            if (width < 0)
                width = 0; /* sanitise for stripctrl_check_line_limit */
        }

        if (wc == '\012') {
            /* Precede \n with \r, because our terminal will not
             * generally be in the ONLCR mode where it assumes that
             * internally, and any \r on input has been stripped
             * out. */
            prefix = PTRLEN_LITERAL("\r");
        }
    }

    stripctrl_check_line_limit(scc, wc, width);

    if (prefix.len)
        put_datapl(scc->bs_out, prefix);

    char outbuf[6];
    size_t produced;

    /*
     * The Terminal implementation encodes 7-bit ASCII characters in
     * UTF-8 mode, and all printing characters in non-UTF-8 (i.e.
     * single-byte character set) mode, as values in the surrogate
     * range (a conveniently unused piece of space in this context)
     * whose low byte is the original 1-byte representation of the
     * character.
     */
    if ((wc - 0xD800) < (0xE000 - 0xD800))
        wc &= 0xFF;

    if (in_utf(scc->term)) {
        produced = encode_utf8(outbuf, wc);
    } else {
        outbuf[0] = wc;
        produced = 1;
    }

    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}